

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false,true,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int64_t *piVar14;
  long lVar15;
  sel_t sVar16;
  idx_t iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  
  if (count + 0x3f < 0x40) {
    iVar17 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar17 = 0;
    lVar19 = 0;
    uVar12 = 0;
    uVar8 = 0;
    do {
      uVar13 = uVar12;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar18 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar18 = count;
        }
LAB_00ef097e:
        if (uVar12 < uVar18) {
          psVar4 = sel->sel_vector;
          iVar1 = rdata->months;
          iVar10 = rdata->days;
          lVar7 = rdata->micros;
          psVar5 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          lVar15 = lVar7 / 86400000000 + (long)iVar10;
          piVar14 = &ldata[uVar12].micros;
          do {
            uVar13 = uVar12;
            if (psVar4 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar4[uVar12];
            }
            lVar11 = *piVar14;
            if ((*(int32_t *)((long)piVar14 + -4) == iVar10 &&
                ((interval_t *)(piVar14 + -1))->months == iVar1) && lVar11 == lVar7) {
              bVar21 = false;
            }
            else {
              lVar20 = (long)*(int32_t *)((long)piVar14 + -4) + lVar11 / 86400000000;
              bVar21 = true;
              if (((long)((interval_t *)(piVar14 + -1))->months + lVar20 / 0x1e ==
                   lVar15 / 0x1e + (long)iVar1) && (lVar20 % 0x1e == lVar15 % 0x1e)) {
                bVar21 = lVar11 % 86400000000 != lVar7 % 86400000000;
              }
            }
            psVar5[iVar17] = (sel_t)uVar13;
            iVar17 = iVar17 + bVar21;
            psVar6[lVar19] = (sel_t)uVar13;
            lVar19 = (ulong)(bVar21 ^ 1) + lVar19;
            uVar12 = uVar12 + 1;
            piVar14 = piVar14 + 2;
            uVar13 = uVar18;
          } while (uVar18 != uVar12);
        }
      }
      else {
        uVar3 = puVar2[uVar8];
        uVar18 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar18 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_00ef097e;
        if (uVar3 == 0) {
          uVar13 = uVar18;
          if (uVar12 < uVar18) {
            psVar4 = sel->sel_vector;
            psVar5 = false_sel->sel_vector;
            do {
              sVar16 = (sel_t)uVar12;
              if (psVar4 != (sel_t *)0x0) {
                sVar16 = psVar4[uVar12];
              }
              psVar5[lVar19] = sVar16;
              lVar19 = lVar19 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar18 != uVar12);
          }
        }
        else if (uVar12 < uVar18) {
          psVar4 = sel->sel_vector;
          psVar5 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          piVar14 = &ldata[uVar12].micros;
          uVar9 = 0;
          do {
            if (psVar4 == (sel_t *)0x0) {
              sVar16 = (int)uVar12 + (int)uVar9;
            }
            else {
              sVar16 = psVar4[uVar12 + uVar9];
            }
            if ((uVar3 >> (uVar9 & 0x3f) & 1) == 0) {
              bVar21 = false;
            }
            else {
              iVar1 = *(int32_t *)((long)piVar14 + -4);
              lVar7 = *piVar14;
              lVar15 = rdata->micros;
              iVar10 = rdata->days;
              if ((rdata->days == iVar1 && rdata->months == ((interval_t *)(piVar14 + -1))->months)
                 && (iVar10 = iVar1, lVar7 == lVar15)) {
                bVar21 = false;
              }
              else {
                lVar20 = (long)iVar1 + lVar7 / 86400000000;
                lVar11 = (long)iVar10 + lVar15 / 86400000000;
                bVar21 = true;
                if (((long)((interval_t *)(piVar14 + -1))->months + lVar20 / 0x1e ==
                     (long)rdata->months + lVar11 / 0x1e) &&
                   (bVar21 = true, lVar20 % 0x1e == lVar11 % 0x1e)) {
                  bVar21 = lVar7 % 86400000000 != lVar15 % 86400000000;
                }
              }
            }
            psVar5[iVar17] = sVar16;
            iVar17 = iVar17 + bVar21;
            psVar6[lVar19] = sVar16;
            lVar19 = (ulong)(bVar21 ^ 1) + lVar19;
            uVar9 = uVar9 + 1;
            piVar14 = piVar14 + 2;
            uVar13 = uVar18;
          } while (uVar18 - uVar12 != uVar9);
        }
      }
      uVar12 = uVar13;
      uVar8 = uVar8 + 1;
    } while (uVar8 != count + 0x3f >> 6);
  }
  return iVar17;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}